

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

Maybe<capnp::InterfaceSchema> __thiscall
capnp::InterfaceSchema::findSuperclass(InterfaceSchema *this,uint64_t typeId,uint *counter)

{
  uint uVar1;
  RawBrandedSchema *pRVar2;
  uint *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX_00;
  uint64_t id;
  ulong uVar4;
  Maybe<capnp::InterfaceSchema> MVar5;
  Reader superclass;
  Reader superclasses;
  Schema local_d8;
  Schema local_d0;
  Reader local_c8;
  StructReader local_98;
  ListReader local_60;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 aVar3;
  
  uVar1 = *in_RCX;
  *in_RCX = uVar1 + 1;
  if (uVar1 < 0x40) {
    pRVar2 = *(RawBrandedSchema **)typeId;
    aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2)counter;
    if ((uint *)(*(RawBrandedSchema **)typeId)->generic->id == counter) {
LAB_0016bf14:
      *(undefined1 *)&(this->super_Schema).raw = 1;
      this[1].super_Schema.raw = pRVar2;
    }
    else {
      Schema::getProto(&local_c8,(Schema *)typeId);
      local_98.dataSize = local_c8._reader.dataSize;
      local_98.pointerCount = local_c8._reader.pointerCount;
      local_98._38_2_ = local_c8._reader._38_2_;
      local_98.nestingLimit = local_c8._reader.nestingLimit;
      local_98._44_4_ = local_c8._reader._44_4_;
      local_98.data = local_c8._reader.data;
      local_98.pointers = local_c8._reader.pointers;
      local_98.capTable = local_c8._reader.capTable;
      capnp::schema::Node::Interface::Reader::getSuperclasses
                ((Reader *)&local_60,(Reader *)&local_98);
      aVar3 = extraout_RDX;
      for (uVar4 = 0; local_60.elementCount != uVar4; uVar4 = uVar4 + 1) {
        _::ListReader::getStructElement(&local_98,&local_60,(ElementCount)uVar4);
        if (local_98.dataSize < 0x40) {
          id = 0;
        }
        else {
          id = *local_98.data;
        }
        local_d8 = Schema::getDependency((Schema *)typeId,id,(ElementCount)uVar4 | 0x4000000);
        local_d0.raw = (RawBrandedSchema *)Schema::asInterface(&local_d8);
        MVar5 = findSuperclass((InterfaceSchema *)&local_c8,(uint64_t)&local_d0,counter);
        aVar3 = MVar5.ptr.field_1;
        pRVar2 = (RawBrandedSchema *)local_c8._reader.capTable;
        if ((char)local_c8._reader.segment == '\x01') goto LAB_0016bf14;
      }
      *(undefined1 *)&(this->super_Schema).raw = 0;
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53]>
              ((Fault *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x288,FAILED,"counter++ < MAX_SUPERCLASSES",
               "\"Cyclic or absurdly-large inheritance graph detected.\"",
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    *(undefined1 *)&(this->super_Schema).raw = 0;
    kj::_::Debug::Fault::~Fault((Fault *)&local_60);
    aVar3 = extraout_RDX_00;
  }
  MVar5.ptr.field_1 = aVar3;
  MVar5.ptr._0_8_ = this;
  return (Maybe<capnp::InterfaceSchema>)MVar5.ptr;
}

Assistant:

kj::Maybe<InterfaceSchema> InterfaceSchema::findSuperclass(uint64_t typeId, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return nullptr;
  }

  if (typeId == raw->generic->id) {
    return *this;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    KJ_IF_MAYBE(result, getDependency(superclass.getId(), location).asInterface()
                            .findSuperclass(typeId, counter)) {
      return *result;
    }
  }

  return nullptr;
}